

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O0

RawTransactionResponseStruct *
cfd::js::api::TransactionStructApi::AddSign
          (RawTransactionResponseStruct *__return_storage_ptr__,AddSignRequestStruct *request)

{
  AddSignRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddSignRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  AddSignRequestStruct *pAStack_18;
  anon_class_1_0_00000001 call_func;
  AddSignRequestStruct *request_local;
  RawTransactionResponseStruct *result;
  
  local_1a = 0;
  pAStack_18 = request;
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  this = pAStack_18;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddSignRequestStruct_const&)>::
  function<cfd::js::api::TransactionStructApi::AddSign(cfd::js::api::AddSignRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddSignRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"AddSign",&local_129);
  ExecuteStructApi<cfd::js::api::AddSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)(local_108 + 0x20),(api *)this,
             (AddSignRequestStruct *)local_108,&local_128,in_R8);
  RawTransactionResponseStruct::operator=
            (__return_storage_ptr__,(RawTransactionResponseStruct *)(local_108 + 0x20));
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddSignRequestStruct_&)>
  ::~function((function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddSignRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct TransactionStructApi::AddSign(
    const AddSignRequestStruct& request) {
  auto call_func =
      [](const AddSignRequestStruct& request) -> RawTransactionResponseStruct {
    RawTransactionResponseStruct response;

    std::string tx_hex = request.tx;
    Txid txid(request.txin.txid);
    uint32_t vout = request.txin.vout;

    std::vector<SignParameter> sign_params;
    const auto& params = (request.txin.sign_params.empty())
                             ? request.txin.sign_param
                             : request.txin.sign_params;
    for (const SignDataStruct& sign_data : params) {
      sign_params.push_back(
          TransactionStructApiBase::ConvertSignDataStructToSignParameter(
              sign_data));
    }

    bool is_witness = request.txin.is_witness;
    bool clear_stack = request.txin.clear_stack;

    TransactionApi api;
    TransactionController txc =
        api.AddSign(tx_hex, txid, vout, sign_params, is_witness, clear_stack);

    response.hex = txc.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result =
      ExecuteStructApi<AddSignRequestStruct, RawTransactionResponseStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}